

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_selectable_text(nk_context *ctx,char *str,int len,nk_flags align,int *value)

{
  float fVar1;
  float fVar2;
  int iVar3;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  nk_widget_layout_states nVar9;
  int iVar10;
  undefined4 in_register_0000000c;
  nk_context *i;
  nk_command_buffer *out;
  nk_rect r;
  nk_rect local_60;
  char *local_50;
  undefined8 local_48;
  nk_rect bounds;
  
  local_48 = CONCAT44(in_register_0000000c,align);
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x51ab,
                  "int nk_selectable_text(struct nk_context *, const char *, int, nk_flags, int *)")
    ;
  }
  if (value == (int *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x51ac,
                  "int nk_selectable_text(struct nk_context *, const char *, int, nk_flags, int *)")
    ;
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x51ad,
                  "int nk_selectable_text(struct nk_context *, const char *, int, nk_flags, int *)")
    ;
  }
  pnVar5 = pnVar4->layout;
  if (pnVar5 != (nk_panel *)0x0) {
    nVar9 = nk_widget(&bounds,ctx);
    if (nVar9 != NK_WIDGET_INVALID) {
      i = (nk_context *)0x0;
      if ((nVar9 != NK_WIDGET_ROM) && ((pnVar5->flags & 0x1000) == 0)) {
        i = ctx;
      }
      font = (ctx->style).font;
      local_60.x = bounds.x;
      local_60.y = bounds.y;
      uVar7 = local_60._0_8_;
      local_60.w = bounds.w;
      local_60.h = bounds.h;
      uVar8 = local_60._8_8_;
      if (str == (char *)0x0) {
        __assert_fail("str",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x3944,
                      "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (len == 0) {
        __assert_fail("len",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x3945,
                      "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (font == (nk_user_font *)0x0) {
        __assert_fail("font",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x3948,
                      "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                     );
      }
      iVar3 = *value;
      local_60.x = bounds.x;
      local_60.y = bounds.y;
      fVar1 = (ctx->style).selectable.touch_padding.x;
      fVar2 = (ctx->style).selectable.touch_padding.y;
      r.x = local_60.x - fVar1;
      local_60.w = bounds.w;
      r.w = fVar1 + fVar1 + local_60.w;
      local_60.h = bounds.h;
      r.h = fVar2 + fVar2 + local_60.h;
      r.y = local_60.y - fVar2;
      local_60._0_8_ = uVar7;
      local_60._8_8_ = uVar8;
      local_50 = str;
      iVar10 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      if (iVar10 != 0) {
        *value = (uint)(*value == 0);
      }
      out = &pnVar4->buffer;
      p_Var6 = (ctx->style).selectable.draw_begin;
      if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var6)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nk_draw_selectable(out,ctx->last_widget_state,&(ctx->style).selectable,*value,&local_60,
                         (nk_rect *)0x0,(nk_image *)0x0,local_50,len,(nk_flags)local_48,font);
      p_Var6 = (ctx->style).selectable.draw_end;
      if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var6)(out,(nk_handle)(ctx->style).selectable.userdata.ptr);
      }
      nVar9 = (nk_widget_layout_states)(iVar3 != *value);
    }
    return nVar9;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x51ae,
                "int nk_selectable_text(struct nk_context *, const char *, int, nk_flags, int *)");
}

Assistant:

NK_API int
nk_selectable_text(struct nk_context *ctx, const char *str, int len,
    nk_flags align, int *value)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    const struct nk_style *style;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(value);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return 0;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_selectable(&ctx->last_widget_state, &win->buffer, bounds,
                str, len, align, value, &style->selectable, in, style->font);
}